

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O1

void cmCMakePresetsErrors::FILE_NOT_FOUND(string *filename,cmJSONState *state)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_40;
  size_type local_28;
  pointer local_20;
  undefined8 local_18;
  
  local_40.first._M_len = 0x10;
  local_40.first._M_str = "File not found: ";
  local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_20 = (filename->_M_dataplus)._M_p;
  local_28 = filename->_M_string_length;
  local_18 = 0;
  views._M_len = 2;
  views._M_array = &local_40;
  cmCatViews(&local_60,views);
  cmJSONState::AddError(state,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FILE_NOT_FOUND(const std::string& filename, cmJSONState* state)
{
  state->AddError(cmStrCat("File not found: ", filename));
}